

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O0

ssize_t __thiscall CSocekt::recvproc(CSocekt *this,lp_connection_t c,char *buff,ssize_t buflen)

{
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  LogLevel LVar1;
  int *piVar2;
  Logger *pLVar3;
  LogStream *this_00;
  size_t in_RCX;
  void *in_RDX;
  long in_RSI;
  ssize_t n;
  LogLevel in_stack_ffffffffffffafc8;
  int in_stack_ffffffffffffafcc;
  CSocekt *in_stack_ffffffffffffafd0;
  char (*in_stack_ffffffffffffafd8) [108];
  SourceFile *in_stack_ffffffffffffafe0;
  Logger *in_stack_ffffffffffffb000;
  Logger local_4fb8;
  Logger local_3fd0;
  Logger local_2fe8;
  Logger local_2000;
  Logger local_1008;
  ssize_t local_30;
  ssize_t local_8;
  
  local_30 = read(*(int *)(in_RSI + 8),in_RDX,in_RCX);
  if (local_30 == 0) {
    LVar1 = muduo::Logger::logLevel();
    if ((int)LVar1 < 3) {
      muduo::Logger::SourceFile::SourceFile<108>
                (in_stack_ffffffffffffafe0,in_stack_ffffffffffffafd8);
      file._8_8_ = in_stack_ffffffffffffafe0;
      file.data_ = *in_stack_ffffffffffffafd8;
      muduo::Logger::Logger((Logger *)in_stack_ffffffffffffafd0,file,in_stack_ffffffffffffafcc);
      muduo::Logger::stream(&local_1008);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffffafe0,*in_stack_ffffffffffffafd8);
      muduo::Logger::~Logger(in_stack_ffffffffffffb000);
    }
    zdClosesocketProc(in_stack_ffffffffffffafd0,
                      (lp_connection_t)CONCAT44(in_stack_ffffffffffffafcc,in_stack_ffffffffffffafc8)
                     );
    local_8 = -1;
  }
  else {
    local_8 = local_30;
    if (local_30 < 0) {
      LVar1 = muduo::Logger::logLevel();
      if ((int)LVar1 < 3) {
        muduo::Logger::SourceFile::SourceFile<108>
                  (in_stack_ffffffffffffafe0,in_stack_ffffffffffffafd8);
        file_00._8_8_ = in_stack_ffffffffffffafe0;
        file_00.data_ = *in_stack_ffffffffffffafd8;
        muduo::Logger::Logger((Logger *)in_stack_ffffffffffffafd0,file_00,in_stack_ffffffffffffafcc)
        ;
        muduo::Logger::stream(&local_2000);
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffffafe0,*in_stack_ffffffffffffafd8);
        __errno_location();
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffffafd0,in_stack_ffffffffffffafcc);
        muduo::Logger::~Logger(in_stack_ffffffffffffb000);
      }
      piVar2 = __errno_location();
      if ((*piVar2 == 0xb) || (piVar2 = __errno_location(), *piVar2 == 0xb)) {
        muduo::Logger::SourceFile::SourceFile<108>
                  (in_stack_ffffffffffffafe0,in_stack_ffffffffffffafd8);
        file_01._8_8_ = in_stack_ffffffffffffafe0;
        file_01.data_ = *in_stack_ffffffffffffafd8;
        muduo::Logger::Logger
                  ((Logger *)in_stack_ffffffffffffafd0,file_01,in_stack_ffffffffffffafcc,
                   in_stack_ffffffffffffafc8);
        pLVar3 = (Logger *)muduo::Logger::stream(&local_2fe8);
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffffafe0,*in_stack_ffffffffffffafd8);
        muduo::Logger::~Logger(pLVar3);
        local_8 = -1;
      }
      else {
        piVar2 = __errno_location();
        if (*piVar2 == 4) {
          muduo::Logger::SourceFile::SourceFile<108>
                    (in_stack_ffffffffffffafe0,in_stack_ffffffffffffafd8);
          file_02._8_8_ = in_stack_ffffffffffffafe0;
          file_02.data_ = *in_stack_ffffffffffffafd8;
          muduo::Logger::Logger
                    ((Logger *)in_stack_ffffffffffffafd0,file_02,in_stack_ffffffffffffafcc,
                     in_stack_ffffffffffffafc8);
          muduo::Logger::stream(&local_3fd0);
          muduo::LogStream::operator<<
                    ((LogStream *)in_stack_ffffffffffffafe0,*in_stack_ffffffffffffafd8);
          muduo::Logger::~Logger(in_stack_ffffffffffffb000);
          local_8 = -1;
        }
        else {
          piVar2 = __errno_location();
          if (*piVar2 != 0x68) {
            muduo::Logger::SourceFile::SourceFile<108>
                      (in_stack_ffffffffffffafe0,in_stack_ffffffffffffafd8);
            pLVar3 = &local_4fb8;
            file_03._8_8_ = in_stack_ffffffffffffafe0;
            file_03.data_ = (char *)pLVar3;
            muduo::Logger::Logger
                      ((Logger *)in_stack_ffffffffffffafd0,file_03,in_stack_ffffffffffffafcc,
                       in_stack_ffffffffffffafc8);
            this_00 = muduo::Logger::stream(pLVar3);
            __errno_location();
            in_stack_ffffffffffffafd0 =
                 (CSocekt *)
                 muduo::LogStream::operator<<
                           ((LogStream *)in_stack_ffffffffffffafd0,in_stack_ffffffffffffafcc);
            muduo::LogStream::operator<<(this_00,(char *)pLVar3);
            muduo::Logger::~Logger(in_stack_ffffffffffffb000);
          }
          zdClosesocketProc(in_stack_ffffffffffffafd0,
                            (lp_connection_t)
                            CONCAT44(in_stack_ffffffffffffafcc,in_stack_ffffffffffffafc8));
          local_8 = -1;
        }
      }
    }
  }
  return local_8;
}

Assistant:

ssize_t CSocekt::recvproc(lp_connection_t c,char *buff,ssize_t buflen)  //ssize_t是有符号整型，在32位机器上等同与int，在64位机器上等同与long int，size_t就是无符号型的ssize_t
{
    ssize_t n;

    n = read(c->fd, buff, buflen); //recv()系统函数， 最后一个参数flag，一般为0；
    if(n == 0)
    {
        //客户端关闭【应该是正常完成了4次挥手】，我这边就直接回收连接连接，关闭socket即可
        LOG_INFO << "连接被客户端正常关闭[4路挥手关闭]！";
        //flyd_close_connection(c);不再是直接关闭连接，而是先从时间队列中去除，再延迟关闭
        zdClosesocketProc(c);
        return -1;
    }
    //客户端没断，走这里
    if(n < 0) //这被认为有错误发生
    {
        LOG_INFO << "errno的值是" << errno;
        //EAGAIN和EWOULDBLOCK[【这个应该常用在hp上】应该是一样的值，表示没收到数据，一般来讲，在ET模式下会出现这个错误，因为ET模式下是不停的recv肯定有一个时刻收到这个errno，但LT模式下一般是来事件才收，所以不该出现这个返回值
        if(errno == EAGAIN || errno == EWOULDBLOCK)
        {
            //我认为LT模式不该出现这个errno，而且这个其实也不是错误，所以不当做错误处理
            LOG_ERROR << "CSocekt::recvproc()中errno == EAGAIN || errno == EWOULDBLOCK成立，出乎我意料！";
            return -1; //不当做错误处理，只是简单返回
        }
        //EINTR错误的产生：当阻塞于某个慢系统调用的一个进程捕获某个信号且相应信号处理函数返回时，该系统调用可能返回一个EINTR错误。
        //例如：在socket服务器端，设置了信号捕获机制，有子进程，当在父进程阻塞于慢系统调用时由父进程捕获到了一个有效信号时，内核会致使accept返回一个EINTR错误(被中断的系统调用)。
        if(errno == EINTR)  //这个不算错误，是我参考官方nginx，官方nginx这个就不算错误；
        {
            //我认为LT模式不该出现这个errno，而且这个其实也不是错误，所以不当做错误处理
            //ngx_log_stderr(errno,"CSocekt::recvproc()中errno == EINTR成立，出乎我意料！");//epoll为LT模式不应该出现这个返回值，所以直接打印出来瞧瞧
            LOG_ERROR << "CSocekt::recvproc()中errno == EAGAIN || errno == EWOULDBLOCK成立，出乎我意料！";
            return -1; //不当做错误处理，只是简单返回
        }

        //所有从这里走下来的错误，都认为异常：意味着我们要关闭客户端套接字要回收连接池中连接；

        //errno参考：http://dhfapiran1.360drm.com
        if(errno == ECONNRESET)  //#define ECONNRESET 104 /* Connection reset by peer */
        {
            //如果客户端没有正常关闭socket连接，却关闭了整个运行程序【真是够粗暴无理的，应该是直接给服务器发送rst包而不是4次挥手包完成连接断开】，那么会产生这个错误
            //10054(WSAECONNRESET)--远程程序正在连接的时候关闭会产生这个错误--远程主机强迫关闭了一个现有的连接
            //算常规错误吧【普通信息型】，日志都不用打印，没啥意思，太普通的错误
            //do nothing

            //....一些大家遇到的很普通的错误信息，也可以往这里增加各种，代码要慢慢完善，一步到位，不可能，很多服务器程序经过很多年的完善才比较圆满；
        }
        else
        {
            //能走到这里的，都表示错误，我打印一下日志，希望知道一下是啥错误，我准备打印到屏幕上
           // ngx_log_stderr(errno,"CSocekt::recvproc()中发生错误，我打印出来看看是啥错误！");  //正式运营时可以考虑这些日志打印去掉
            LOG_ERROR << errno << "CSocekt::recvproc()中发生错误，我打印出来看看是啥错误！";
        }

        //ngx_log_stderr(0,"连接被客户端 非 正常关闭！");

        //这种真正的错误就要，直接关闭套接字，释放连接池中连接了
       // flyd_close_connection(c);
       zdClosesocketProc(c);
        return -1;
    }

    //能走到这里的，就认为收到了有效数据
    return n; //返回收到的字节数
}